

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68020_unpk_mm(m68k_info *info)

{
  uint imm;
  ulong uVar1;
  
  if ((info->type & 0x1c) != 0) {
    uVar1 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
    imm = 0xaaaa;
    if (uVar1 + 2 <= info->code_len) {
      imm = (uint)(ushort)(*(ushort *)(info->code + uVar1) << 8 |
                          *(ushort *)(info->code + uVar1) >> 8);
    }
    info->pc = info->pc + 2;
    build_mm(info,0x176,'\0',imm);
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68020_unpk_mm(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_mm(info, M68K_INS_UNPK, 0, read_imm_16(info));
}